

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O2

void __thiscall
cmParseCoberturaCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_00639ed8;
  this->InSources = false;
  this->InSource = false;
  this->SkipThisClass = false;
  std::__cxx11::string::string((string *)&local_60,(string *)&cont->SourceDir);
  std::__cxx11::string::string(local_40,(string *)&cont->BinaryDir);
  __l._M_len = 2;
  __l._M_array = &local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->FilePaths,__l,&local_61);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_60._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  this->CTest = ctest;
  this->Coverage = cont;
  (this->CurFileName)._M_dataplus._M_p = (pointer)&(this->CurFileName).field_2;
  (this->CurFileName)._M_string_length = 0;
  (this->CurFileName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : FilePaths{ cont.SourceDir, cont.BinaryDir }
    , CTest(ctest)
    , Coverage(cont)
  {
  }